

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_all.h
# Opt level: O2

void __thiscall
wasm::FindAll<wasm::TableSet>::FindAll(FindAll<wasm::TableSet> *this,Expression *ast)

{
  undefined1 auStack_108 [8];
  Finder finder;
  Expression *ast_local;
  
  (this->list).super__Vector_base<wasm::TableSet_*,_std::allocator<wasm::TableSet_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->list).super__Vector_base<wasm::TableSet_*,_std::allocator<wasm::TableSet_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->list).super__Vector_base<wasm::TableSet_*,_std::allocator<wasm::TableSet_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auStack_108 = (undefined1  [8])0x0;
  finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
  super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.replacep = (Expression **)0x0;
  finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
  super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack.fixed._M_elems[9].currp
       = (Expression **)0x0;
  finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
  super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task,_std::allocator<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
  super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task,_std::allocator<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
  super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task,_std::allocator<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
  super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.currFunction = (Function *)0x0
  ;
  finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
  super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.currModule = (Module *)this;
  finder.list = (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)ast;
  Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::walk
            ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)auStack_108,
             (Expression **)&finder.list);
  std::
  _Vector_base<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task,_std::allocator<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task>_>
  ::~_Vector_base((_Vector_base<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task,_std::allocator<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task>_>
                   *)((long)(finder.
                             super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>
                             .super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
                             stack.fixed._M_elems + 9) + 8));
  return;
}

Assistant:

FindAll(Expression* ast) {
    struct Finder
      : public PostWalker<Finder, UnifiedExpressionVisitor<Finder>> {
      std::vector<T*>* list;
      void visitExpression(Expression* curr) {
        if (curr->is<T>()) {
          (*list).push_back(curr->cast<T>());
        }
      }
    };
    Finder finder;
    finder.list = &list;
    finder.walk(ast);
  }